

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

void testing::internal::PrintCharAndCodeTo<unsigned_char,unsigned_char>(uchar c,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  int value;
  int value_00;
  int iVar3;
  char *pcVar4;
  undefined7 in_register_00000039;
  ulong uVar5;
  string local_60;
  string local_40;
  
  uVar5 = CONCAT71(in_register_00000039,c);
  std::operator<<(os,"\'");
  iVar3 = (int)uVar5;
  switch(uVar5 & 0xffffffff) {
  case 0:
    pcVar4 = "\\0";
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_002db09c_caseD_1:
    if (0x5e < iVar3 - 0x20U) {
      String::FormatHexInt_abi_cxx11_(&local_40,(String *)(uVar5 & 0xffffffff),value);
      std::operator+(&local_60,"\\x",&local_40);
      std::operator<<(os,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      bVar1 = true;
      goto LAB_002db127;
    }
    std::operator<<(os,c);
    goto LAB_002db124;
  case 7:
    pcVar4 = "\\a";
    break;
  case 8:
    pcVar4 = "\\b";
    break;
  case 9:
    pcVar4 = "\\t";
    break;
  case 10:
    pcVar4 = "\\n";
    break;
  case 0xb:
    pcVar4 = "\\v";
    break;
  case 0xc:
    pcVar4 = "\\f";
    break;
  case 0xd:
    pcVar4 = "\\r";
    break;
  default:
    if (iVar3 == 0x27) {
      pcVar4 = "\\\'";
    }
    else {
      if (iVar3 != 0x5c) goto switchD_002db09c_caseD_1;
      pcVar4 = "\\\\";
    }
  }
  std::operator<<(os,pcVar4);
LAB_002db124:
  bVar1 = false;
LAB_002db127:
  std::operator<<(os,"\'");
  if (c != '\0') {
    poVar2 = std::operator<<(os," (");
    std::ostream::operator<<(poVar2,iVar3);
    if (9 < c && !bVar1) {
      poVar2 = std::operator<<(os,", 0x");
      String::FormatHexInt_abi_cxx11_(&local_60,(String *)(uVar5 & 0xffffffff),value_00);
      std::operator<<(poVar2,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::operator<<(os,")");
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexidecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<UnsignedChar>(c));
  }
  *os << ")";
}